

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3OsOpenMalloc(sqlite3_vfs *pVfs,char *zFile,sqlite3_file **ppFile,int flags,int *pOutFlags
                       )

{
  int iVar1;
  sqlite3_file *p;
  
  p = (sqlite3_file *)sqlite3MallocZero(pVfs->szOsFile);
  if (p == (sqlite3_file *)0x0) {
    iVar1 = 7;
  }
  else {
    iVar1 = (*pVfs->xOpen)(pVfs,zFile,p,flags & 0x87f7f,pOutFlags);
    if (iVar1 == 0) {
      *ppFile = p;
      iVar1 = 0;
    }
    else {
      sqlite3_free(p);
    }
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3OsOpenMalloc(
  sqlite3_vfs *pVfs, 
  const char *zFile, 
  sqlite3_file **ppFile, 
  int flags,
  int *pOutFlags
){
  int rc = SQLITE_NOMEM;
  sqlite3_file *pFile;
  pFile = (sqlite3_file *)sqlite3MallocZero(pVfs->szOsFile);
  if( pFile ){
    rc = sqlite3OsOpen(pVfs, zFile, pFile, flags, pOutFlags);
    if( rc!=SQLITE_OK ){
      sqlite3_free(pFile);
    }else{
      *ppFile = pFile;
    }
  }
  return rc;
}